

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
write_significand<char,fmt::v11::basic_appender<char>,unsigned_int,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,uint significand,int significand_size,int exponent,
          digit_grouping<char> *grouping)

{
  bool bVar1;
  char *s;
  size_t count;
  undefined8 in_RDI;
  memory_buffer buffer;
  digit_grouping<char> *in_stack_000005b0;
  basic_string_view<char> in_stack_000005b8;
  basic_appender<char> in_stack_000005c8;
  allocator<char> *in_stack_fffffffffffffd08;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffd10;
  buffer<char> *this;
  basic_appender<char> in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  int count_00;
  basic_appender<char> in_stack_fffffffffffffd28;
  basic_string_view<char> local_2b8;
  undefined8 local_2a8;
  buffer<char> *local_2a0;
  undefined1 local_291;
  basic_appender<char> local_290;
  buffer<char> *local_288;
  basic_appender<char> local_270 [2];
  buffer<char> local_260 [16];
  undefined1 local_41;
  buffer<char> *local_40;
  undefined8 local_38;
  buffer<char> *local_30;
  buffer<char> *local_10;
  buffer<char> *local_8;
  
  count_00 = (int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  local_10 = (buffer<char> *)in_RDI;
  bVar1 = digit_grouping<char>::has_separator((digit_grouping<char> *)0x70a579);
  if (bVar1) {
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    basic_appender<char>::basic_appender(local_270,local_260);
    local_288 = (buffer<char> *)
                write_significand<char,fmt::v11::basic_appender<char>,unsigned_int>
                          (in_stack_fffffffffffffd18,
                           (uint)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                           (int)in_stack_fffffffffffffd10);
    basic_appender<char>::basic_appender(&local_290,local_260);
    local_291 = 0x30;
    local_2a0 = (buffer<char> *)
                fill_n<fmt::v11::basic_appender<char>,int,char>
                          (in_stack_fffffffffffffd28,count_00,in_stack_fffffffffffffd18.container);
    local_2a8 = local_10;
    this = local_260;
    s = buffer<char>::data(this);
    count = buffer<char>::size(this);
    basic_string_view<char>::basic_string_view(&local_2b8,s,count);
    local_8 = (buffer<char> *)
              digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>
                        (in_stack_000005b0,in_stack_000005c8,in_stack_000005b8);
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x70a726);
  }
  else {
    local_38 = local_10;
    local_40 = (buffer<char> *)
               write_significand<char,fmt::v11::basic_appender<char>,unsigned_int>
                         (in_stack_fffffffffffffd18,(uint)((ulong)in_stack_fffffffffffffd10 >> 0x20)
                          ,(int)in_stack_fffffffffffffd10);
    local_41 = 0x30;
    local_30 = local_40;
    local_10 = local_40;
    local_8 = (buffer<char> *)
              fill_n<fmt::v11::basic_appender<char>,int,char>
                        (in_stack_fffffffffffffd28,count_00,in_stack_fffffffffffffd18.container);
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}